

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

MatrixXd * __thiscall
ChebTools::ChebyshevExpansion::companion_matrix
          (MatrixXd *__return_storage_ptr__,ChebyshevExpansion *this,VectorXd *coeffs)

{
  VectorXd VVar1;
  ArrayXd local_40;
  VectorXd new_mc;
  VectorXd *coeffs_local;
  ChebyshevExpansion *this_local;
  
  new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)coeffs;
  VVar1 = reduce_zeros((ChebyshevExpansion *)&stack0xffffffffffffffd0,coeffs);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Array<double,_1,1,0,_1,1> *)&local_40,(ChebyshevExpansion *)&stack0xffffffffffffffd0,
             VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  companion_matrix_noreduce(__return_storage_ptr__,this,&local_40);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_40);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd ChebyshevExpansion::companion_matrix(const Eigen::VectorXd &coeffs) const {
        Eigen::VectorXd new_mc = reduce_zeros(coeffs);
        return companion_matrix_noreduce(new_mc);
    }